

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void config_set_value(ALLEGRO_CONFIG *config,ALLEGRO_USTR *section,ALLEGRO_USTR *key,
                     ALLEGRO_USTR *value)

{
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_CONFIG_SECTION *pAVar2;
  void *pvVar3;
  ALLEGRO_CONFIG_ENTRY *value_00;
  ALLEGRO_USTR *pAVar4;
  Aatree *pAVar5;
  
  pAVar2 = (ALLEGRO_CONFIG_SECTION *)_al_aa_search((Aatree *)config->tree,section,cmp_ustr);
  if (pAVar2 != (ALLEGRO_CONFIG_SECTION *)0x0) {
    pvVar3 = _al_aa_search((Aatree *)pAVar2->tree,key,cmp_ustr);
    if (pvVar3 != (void *)0x0) {
      al_ustr_assign(*(ALLEGRO_USTR **)((long)pvVar3 + 0x10),value);
      al_ustr_trim_ws(*(ALLEGRO_USTR **)((long)pvVar3 + 0x10));
      return;
    }
  }
  value_00 = (ALLEGRO_CONFIG_ENTRY *)
             al_calloc_with_context
                       (1,0x28,0x89,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/config.c"
                        ,"config_set_value");
  value_00->is_comment = false;
  pAVar4 = al_ustr_dup(key);
  value_00->key = pAVar4;
  pAVar4 = al_ustr_dup(value);
  value_00->value = pAVar4;
  al_ustr_trim_ws(pAVar4);
  if (pAVar2 == (ALLEGRO_CONFIG_SECTION *)0x0) {
    pAVar2 = config_add_section(config,section);
  }
  if (pAVar2->head == (ALLEGRO_CONFIG_ENTRY *)0x0) {
    pAVar2->head = value_00;
  }
  else {
    pAVar1 = pAVar2->last;
    pAVar1->next = value_00;
    value_00->prev = pAVar1;
  }
  pAVar2->last = value_00;
  pAVar5 = _al_aa_insert((Aatree *)pAVar2->tree,value_00->key,value_00,cmp_ustr);
  pAVar2->tree = (_AL_AATREE *)pAVar5;
  return;
}

Assistant:

static void config_set_value(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *section, const ALLEGRO_USTR *key,
   const ALLEGRO_USTR *value)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *entry;

   s = find_section(config, section);
   if (s) {
      entry = find_entry(s, key);
      if (entry) {
         al_ustr_assign(entry->value, value);
         al_ustr_trim_ws(entry->value);
         return;
      }
   }

   entry = al_calloc(1, sizeof(ALLEGRO_CONFIG_ENTRY));
   entry->is_comment = false;
   entry->key = al_ustr_dup(key);
   entry->value = al_ustr_dup(value);
   al_ustr_trim_ws(entry->value);

   if (!s) {
      s = config_add_section(config, section);
   }

   if (s->head == NULL) {
      s->head = entry;
      s->last = entry;
   }
   else {
      ASSERT(s->last->next == NULL);
      s->last->next = entry;
      entry->prev = s->last;
      s->last = entry;
   }

   s->tree = _al_aa_insert(s->tree, entry->key, entry, cmp_ustr);
}